

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::Generator::interface
          (Generator *this,shared_ptr<kratos::IDefinition> *def,string *interface_name,bool is_port)

{
  _Rb_tree_node_base *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar1;
  string *__args_1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  VarException *this_01;
  mapped_type *pmVar5;
  UserException *pUVar6;
  undefined7 in_register_00000009;
  string *__k;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_R8D;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Rb_tree_node_base *p_Var7;
  shared_ptr<kratos::InterfaceRef> sVar8;
  basic_string_view<char> bVar9;
  undefined1 auVar10 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  initializer_list<const_kratos::IRNode_*> __l;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  undefined1 local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name_1;
  undefined1 auStack_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  undefined1 local_f0 [8];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [40];
  undefined1 auStack_98 [8];
  shared_ptr<kratos::InterfaceVar> v;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  *local_48;
  string *local_40;
  undefined4 local_38;
  undefined1 local_31;
  
  __k = (string *)CONCAT71(in_register_00000009,is_port);
  local_48 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)(def + 0x10);
  local_40 = interface_name;
  local_38 = in_R8D;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                  *)local_48,__k);
  if (iVar3._M_node !=
      (_Base_ptr)
      &def[0x10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    this_01 = (VarException *)__cxa_allocate_exception(0x10);
    local_c8 = (undefined1  [8])(__k->_M_dataplus)._M_p;
    auStack_c0._0_8_ = __k->_M_string_length;
    auStack_c0._8_8_ =
         def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    auStack_c0._16_8_ =
         def[10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar9 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
    format_str_01.data_ = (char *)bVar9.size_;
    format_str_01.size_ = 0xdd;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_c8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_98,(detail *)bVar9.data_,format_str_01,args_01);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *)local_48,__k);
    local_f0 = (undefined1  [8])
               (pmVar5->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 1;
    __l._M_array = (iterator)local_f0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_c8,
               __l,(allocator_type *)auStack_118);
    VarException::VarException
              (this_01,(string *)auStack_98,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_c8);
    __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &def[0x48].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                  *)this_00,__k);
  if (iVar4._M_node == (_Base_ptr)(def + 0x49)) {
    bVar2 = is_valid_variable_name(__k);
    __args_1 = local_40;
    if (bVar2) {
      var_name_1.field_2._8_8_ = this_00;
      (**(code **)(*(long *)(local_40->_M_dataplus)._M_p + 0x28))(local_c8);
      auStack_98 = (undefined1  [8])def;
      local_68.field_2._M_allocated_capacity = (size_type)def;
      local_68.field_2._8_8_ = __k;
      sVar8 = std::
              make_shared<kratos::InterfaceRef,std::shared_ptr<kratos::IDefinition>const&,kratos::Generator*,std::__cxx11::string_const&>
                        ((shared_ptr<kratos::IDefinition> *)this,(Generator **)__args_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_98);
      auVar10._8_8_ =
           sVar8.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._M_pi;
      auVar10._0_8_ = auStack_c0._16_8_;
      *(char *)((this->super_IRNode)._vptr_IRNode + 0x10) = (char)local_38;
      while (p_Var7 = auVar10._0_8_, p_Var7 != (_Rb_tree_node_base *)auStack_c0) {
        name = p_Var7 + 1;
        plVar1 = (long *)(local_40->_M_dataplus)._M_p;
        (**(code **)(*plVar1 + 0x18))(local_f0,plVar1,name);
        auStack_98 = *(undefined1 (*) [8])local_68.field_2._8_8_;
        v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(local_68.field_2._8_8_ + 8);
        v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var7 + 1);
        uStack_80 = p_Var7[1]._M_parent;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
        format_str.data_ = (char *)bVar9.size_;
        format_str.size_ = 0xdd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_98;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_118,(detail *)bVar9.data_,format_str,args);
        local_140 = (undefined1  [8])(this->super_IRNode)._vptr_IRNode;
        local_68._M_dataplus._M_p = (pointer)local_68.field_2._M_allocated_capacity;
        local_68._M_string_length = local_68._M_string_length & 0xffffffffffffff00;
        in_R9.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_e8;
        std::
        make_shared<kratos::InterfaceVar,kratos::InterfaceRef*,kratos::Generator*,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool>
                  ((InterfaceRef **)auStack_98,(Generator **)local_140,&local_68,&name->_M_color,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,
                   (bool *)in_R9.values_);
        InterfaceRef::var((InterfaceRef *)(this->super_IRNode)._vptr_IRNode,(string *)name,
                          (Var *)auStack_98);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::InterfaceVar>&>
                  (local_48,(string *)auStack_118,(shared_ptr<kratos::InterfaceVar> *)auStack_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
        std::__cxx11::string::~string((string *)auStack_118);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e8);
        auVar10 = std::_Rb_tree_increment(p_Var7);
      }
      plVar1 = (long *)(local_40->_M_dataplus)._M_p;
      (**(code **)(*plVar1 + 0x20))(auStack_98,plVar1,auVar10._8_8_);
      for (; (_Rb_tree_node_base *)uStack_80 != (_Rb_tree_node_base *)&v;
          uStack_80 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_80)) {
        p_Var7 = (_Rb_tree_node_base *)(uStack_80 + 0x20);
        plVar1 = (long *)(local_40->_M_dataplus)._M_p;
        (**(code **)(*plVar1 + 0x10))(local_f0,plVar1,p_Var7);
        auStack_118 = *(undefined1 (*) [8])local_68.field_2._8_8_;
        var_name._M_dataplus._M_p = *(pointer *)(local_68.field_2._8_8_ + 8);
        var_name._M_string_length = *(size_type *)(uStack_80 + 0x20);
        var_name.field_2._M_allocated_capacity =
             (size_type)((_Rb_tree_node_base *)(uStack_80 + 0x20))->_M_parent;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
        format_str_00.data_ = (char *)bVar9.size_;
        format_str_00.size_ = 0xdd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_118;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_140,(detail *)bVar9.data_,format_str_00,args_00);
        local_68._M_dataplus._M_p = (pointer)(this->super_IRNode)._vptr_IRNode;
        local_68._M_string_length = local_68.field_2._M_allocated_capacity;
        local_31 = 0;
        in_R9.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             local_d0;
        std::
        make_shared<kratos::InterfacePort,kratos::InterfaceRef*,kratos::Generator*,kratos::PortDirection_const&,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType_const&,bool>
                  ((InterfaceRef **)auStack_118,(Generator **)&local_68,
                   (PortDirection *)&local_68._M_string_length,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 4),(uint *)p_Var7,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_R9.values_,
                   (PortType *)&local_e8,(bool *)local_f0);
        InterfaceRef::port((InterfaceRef *)(this->super_IRNode)._vptr_IRNode,(string *)p_Var7,
                           (Port *)auStack_118);
        if ((char)local_38 != '\0') {
          (**(code **)(*(long *)local_68.field_2._M_allocated_capacity + 0x38))
                    (local_68.field_2._M_allocated_capacity,(string *)local_140);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::InterfacePort>&>
                  (local_48,(string *)local_140,(shared_ptr<kratos::InterfacePort> *)auStack_118);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_name);
        std::__cxx11::string::~string((string *)local_140);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e8);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceRef>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
                  *)var_name_1.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_68.field_2._8_8_,(shared_ptr<kratos::InterfaceRef> *)this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
      sVar8.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar8.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<kratos::InterfaceRef>)
             sVar8.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
    }
    pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_98 = (undefined1  [8])(__k->_M_dataplus)._M_p;
    v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)__k->_M_string_length;
    bVar9 = fmt::v7::to_string_view<char,_0>("{0} is a SystemVerilog keyword");
    format_str_03.data_ = (char *)bVar9.size_;
    format_str_03.size_ = 0xd;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_98;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_c8,(detail *)bVar9.data_,format_str_03,args_03);
    UserException::UserException(pUVar6,(string *)local_c8);
    __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
  local_c8 = (undefined1  [8])(__k->_M_dataplus)._M_p;
  auStack_c0._0_8_ = __k->_M_string_length;
  auStack_c0._8_8_ =
       def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auStack_c0._16_8_ =
       def[10].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar9 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
  format_str_02.data_ = (char *)bVar9.size_;
  format_str_02.size_ = 0xdd;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_c8;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)auStack_98,(detail *)bVar9.data_,format_str_02,args_02);
  UserException::UserException(pUVar6,(string *)auStack_98);
  __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<InterfaceRef> Generator::interface(const std::shared_ptr<IDefinition> &def,
                                                   const std::string &interface_name,
                                                   bool is_port) {
    // making sure that it doesn't have ports or vars
    if (vars_.find(interface_name) != vars_.end()) {
        throw VarException(::format("{0} already exists in {1}", interface_name, instance_name),
                           {vars_.at(interface_name).get()});
    }
    if (interfaces_.find(interface_name) != interfaces_.end()) {
        throw UserException(::format("{0} already exists in {1}", interface_name, instance_name));
    }
    // check to see if it's a valid name
    if (!is_valid_variable_name(interface_name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", interface_name));
    }
    // create vars
    auto const &vars = def->vars();
    auto ref = std::make_shared<InterfaceRef>(def, this, interface_name);
    ref->is_port() = is_port;
    for (auto const &n : vars) {
        auto const &[width, size] = def->var(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto v = std::make_shared<InterfaceVar>(ref.get(), this, n, width, size, false);
        ref->var(n, v.get());
        vars_.emplace(var_name, v);
    }
    auto const &ports = def->ports();
    for (auto const &n : ports) {
        auto const &[width, size, dir, type] = def->port(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto p = std::make_shared<InterfacePort>(ref.get(), this, dir, n, width, size, type, false);
        ref->port(n, p.get());
        if (is_port) add_port_name(var_name);
        vars_.emplace(var_name, p);
    }
    // put it in the interface
    interfaces_.emplace(interface_name, ref);
    return ref;
}